

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O3

void __thiscall
tcu::TestNode::getChildren
          (TestNode *this,vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *res)

{
  pointer *pppTVar1;
  iterator __position;
  pointer ppTVar2;
  long lVar3;
  long lVar4;
  
  ppTVar2 = (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppTVar2) {
    (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
  }
  ppTVar2 = (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_children).
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) >> 3)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      __position._M_current =
           (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
        _M_realloc_insert<tcu::TestNode*const&>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)res,__position,
                   (TestNode **)((long)ppTVar2 + lVar4));
      }
      else {
        *__position._M_current = *(TestNode **)((long)ppTVar2 + lVar4);
        pppTVar1 = &(res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      lVar3 = lVar3 + 1;
      ppTVar2 = (this->m_children).
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (lVar3 < (int)((ulong)((long)(this->m_children).
                                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2)
                          >> 3));
  }
  return;
}

Assistant:

void TestNode::getChildren (vector<TestNode*>& res)
{
	res.clear();
	for (int i = 0; i < (int)m_children.size(); i++)
		res.push_back(m_children[i]);
}